

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.c
# Opt level: O3

decNumber_conflict *
decNumberNextMinus(decNumber_conflict *res,decNumber_conflict *rhs,decContext *set)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  decContext workset;
  uint32_t local_4c;
  decContext local_48;
  decNumber_conflict local_24;
  
  local_48.digits = set->digits;
  local_48.emax = set->emax;
  uVar1 = set->emin;
  uVar2 = set->round;
  uVar3 = set->traps;
  local_48.status = set->status;
  local_48.clamp = set->clamp;
  local_48._25_3_ = *(undefined3 *)&set->field_0x19;
  local_4c = 0;
  local_48.emin = uVar1;
  local_48.traps = uVar3;
  if ((rhs->bits & 0xc0) == 0x40) {
    local_48.round = uVar2;
    decSetMaxValue(res,set);
  }
  else {
    local_24.bits = '\0';
    local_24.digits = 1;
    local_24.exponent = -1000000000;
    local_24.lsu[0] = 1;
    local_48.round = DEC_ROUND_FLOOR;
    decAddOp(res,rhs,&local_24,&local_48,0x80,&local_4c);
    if ((local_4c & 0x40000080) != 0) {
      decStatus(res,local_4c & 0x40000080,set);
    }
  }
  return res;
}

Assistant:

decNumber * decNumberNextMinus(decNumber *res, const decNumber *rhs,
			       decContext *set) {
  decNumber dtiny;			     /* constant */
  decContext workset=*set;		     /* work */
  uInt status=0;			     /* accumulator */
  #if DECCHECK
  if (decCheckOperands(res, DECUNUSED, rhs, set)) return res;
  #endif

  /* +Infinity is the special case */
  if ((rhs->bits&(DECINF|DECNEG))==DECINF) {
    decSetMaxValue(res, set);		     /* is +ve */
    /* there is no status to set */
    return res;
    }
  decNumberZero(&dtiny);		     /* start with 0 */
  dtiny.lsu[0]=1;			     /* make number that is .. */
  dtiny.exponent=DEC_MIN_EMIN-1;	     /* .. smaller than tiniest */
  workset.round=DEC_ROUND_FLOOR;
  decAddOp(res, rhs, &dtiny, &workset, DECNEG, &status);
  status&=DEC_Invalid_operation|DEC_sNaN;    /* only sNaN Invalid please */
  if (status!=0) decStatus(res, status, set);
  return res;
  }